

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

Point2f __thiscall
pbrt::CylindricalMapping2D::Map
          (CylindricalMapping2D *this,TextureEvalContext ctx,Vector2f *dstdx,Vector2f *dstdy)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  Tuple2<pbrt::Vector2,_float> TVar2;
  Point3f *p;
  float *pfVar3;
  Tuple2<pbrt::Vector2,_float> *in_RDX;
  Tuple2<pbrt::Vector2,_float> *in_RSI;
  undefined8 in_RDI;
  undefined1 auVar4 [64];
  undefined1 auVar15 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Vector3<float> VVar16;
  Point3<float> PVar17;
  Point2f stDeltaY;
  Point2f stDeltaX;
  Float delta;
  Point2f st;
  Tuple2<pbrt::Vector2,_float> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  float fVar18;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 uVar19;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  Tuple3<pbrt::Vector3,_float> *t;
  Point3f *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  
  fVar18 = (float)((ulong)in_RDI >> 0x20);
  t = (Tuple3<pbrt::Vector3,_float> *)&stack0x00000008;
  auVar4._0_8_ = cylinder((CylindricalMapping2D *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70);
  auVar4._8_56_ = extraout_var;
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar4._0_16_);
  auVar15 = (undefined1  [56])0x0;
  VVar16 = pbrt::operator*(fVar18,t);
  auVar5._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar15;
  vmovlpd_avx(auVar5._0_16_);
  PVar17 = Point3<float>::operator+
                     ((Point3<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                      ,(Vector3<float> *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  auVar6._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar15;
  vmovlpd_avx(auVar6._0_16_);
  auVar7._0_8_ = cylinder((CylindricalMapping2D *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70);
  auVar7._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar7._0_16_);
  auVar8._0_8_ = Point2<float>::operator-
                           ((Point2<float> *)in_stack_fffffffffffffef8,(Point2<float> *)0x6e9993);
  auVar8._8_56_ = extraout_var_01;
  vmovlpd_avx(auVar8._0_16_);
  auVar9._0_8_ = Tuple2<pbrt::Vector2,float>::operator/(in_stack_fffffffffffffef8,0.0);
  auVar9._8_56_ = extraout_var_02;
  TVar2 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(auVar9._0_16_);
  *in_RSI = TVar2;
  pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
  if (*pfVar3 <= 0.5) {
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
    if (*pfVar3 < -0.5) {
      pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
      in_stack_ffffffffffffff10 = -(*pfVar3 + 1.0);
      pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
      *pfVar3 = in_stack_ffffffffffffff10;
    }
  }
  else {
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
    in_stack_ffffffffffffff14 = 1.0 - *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
    *pfVar3 = in_stack_ffffffffffffff14;
  }
  auVar15 = (undefined1  [56])0x0;
  uVar19 = 0x3c23d70a;
  VVar16 = pbrt::operator*(fVar18,t);
  auVar10._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar15;
  vmovlpd_avx(auVar10._0_16_);
  PVar17 = Point3<float>::operator+
                     ((Point3<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                      ,(Vector3<float> *)CONCAT44(uVar19,in_stack_ffffffffffffff08));
  auVar11._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar15;
  p = (Point3f *)vmovlpd_avx(auVar11._0_16_);
  auVar12._0_8_ =
       cylinder((CylindricalMapping2D *)
                CONCAT44(in_stack_ffffffffffffff7c,PVar17.super_Tuple3<pbrt::Point3,_float>.z),p);
  auVar12._8_56_ = extraout_var_03;
  vmovlpd_avx(auVar12._0_16_);
  auVar13._0_8_ =
       Point2<float>::operator-
                 ((Point2<float> *)in_stack_fffffffffffffef8,(Point2<float> *)0x6e9b3f);
  auVar13._8_56_ = extraout_var_04;
  vmovlpd_avx(auVar13._0_16_);
  auVar14._0_8_ = Tuple2<pbrt::Vector2,float>::operator/(in_stack_fffffffffffffef8,0.0);
  auVar14._8_56_ = extraout_var_05;
  TVar2 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(auVar14._0_16_);
  *in_RDX = TVar2;
  pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
  if (*pfVar3 <= 0.5) {
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
    if (*pfVar3 < -0.5) {
      pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
      fVar18 = *pfVar3;
      pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
      *pfVar3 = -(fVar18 + 1.0);
    }
  }
  else {
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
    fVar18 = 1.0 - *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
    *pfVar3 = fVar18;
  }
  return (Point2f)TVar1;
}

Assistant:

PBRT_CPU_GPU
    Point2f Map(TextureEvalContext ctx, Vector2f *dstdx, Vector2f *dstdy) const {
        Point2f st = cylinder(ctx.p);
        // Compute texture coordinate differentials for cylinder $(u,v)$ mapping
        const Float delta = .01f;
        Point2f stDeltaX = cylinder(ctx.p + delta * ctx.dpdx);
        *dstdx = (stDeltaX - st) / delta;
        if ((*dstdx)[1] > .5)
            (*dstdx)[1] = 1.f - (*dstdx)[1];
        else if ((*dstdx)[1] < -.5f)
            (*dstdx)[1] = -((*dstdx)[1] + 1);
        Point2f stDeltaY = cylinder(ctx.p + delta * ctx.dpdy);
        *dstdy = (stDeltaY - st) / delta;
        if ((*dstdy)[1] > .5)
            (*dstdy)[1] = 1.f - (*dstdy)[1];
        else if ((*dstdy)[1] < -.5f)
            (*dstdy)[1] = -((*dstdy)[1] + 1);

        return st;
    }